

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O2

void __thiscall
printable_vtable::printable_vtable<large_printable>(printable_vtable *this,large_printable *value)

{
  pointer pdVar1;
  undefined8 *puVar2;
  
  (this->vtable_)._M_elems[2] = print_wrapper<large_printable>::exec;
  (this->vtable_)._M_elems[0] = clone_impl<large_printable>;
  (this->vtable_)._M_elems[1] = delete_impl<large_printable>;
  this->get_value_ptr_ = get_value_ptr<true>;
  this->value_ = (void *)0x0;
  puVar2 = (undefined8 *)operator_new(0x2018);
  pdVar1 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  *puVar2 = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2[1] = pdVar1;
  puVar2[2] = (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->value_ = puVar2;
  return;
}

Assistant:

printable_vtable (T value) :
        vtable_ ({
            (void_function_type)(&clone_impl<T>),
            (void_function_type)(&delete_impl<T>),
            (void_function_type)(&print_wrapper<T>::exec)
        }),
        get_value_ptr_ (&get_value_ptr<sizeof(value_) < sizeof(T)>),
        value_ (0)
    {
        if (sizeof(T) <= sizeof(value_))
            new (&value_) T(std::move(value));
        else
            value_ = new T(std::move(value));
    }